

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::iterate(UserDefinedIOCase *this)

{
  ostream *this_00;
  TessPrimitiveType primitiveType;
  IOType IVar1;
  uint uVar2;
  Archive *archive;
  TopLevelObject *pTVar3;
  undefined8 *puVar4;
  TextureFormat TVar5;
  pointer puVar6;
  bool bVar7;
  int iVar8;
  deUint32 dVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ObjectTraits *pOVar12;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar13;
  long *plVar14;
  TextureFormat *pTVar15;
  pointer pSVar16;
  TestError *pTVar17;
  long *plVar18;
  TextureFormat TVar19;
  ulong *puVar20;
  ulong uVar21;
  RenderContext *pRVar22;
  void *pvVar23;
  long lVar24;
  ostringstream *poVar25;
  uint uVar26;
  uint uVar27;
  Surface pixels;
  RandomViewport viewport;
  Result tfResult;
  TFHandler tfHandler;
  TextureLevel reference;
  ResultCollector result;
  undefined1 local_408 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  deUint32 local_3dc;
  RenderContext *local_3d8;
  Surface local_3d0;
  long lStack_3b8;
  RandomViewport local_3b0;
  ulong local_3a0;
  TextureFormat local_398;
  PrimitiveType local_38c;
  undefined1 local_388 [16];
  long local_378;
  TextureFormat TStack_370;
  PrimitiveType local_360;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_358;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_340;
  TextureFormat local_328;
  TextureFormat local_320;
  long local_318;
  TextureFormat TStack_310;
  long *local_308;
  long local_300;
  long local_2f8;
  long lStack_2f0;
  void **local_2e8;
  long local_2e0;
  void *local_2d8 [2];
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8;
  undefined7 uStack_2b7;
  undefined1 local_2a8 [8];
  _Alloc_hider local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  int local_280;
  VertexArrayPointer local_278;
  RenderContext *local_250;
  ObjectWrapper local_248;
  ObjectWrapper local_230;
  ObjectWrapper local_218;
  undefined1 local_200 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  int local_1d8;
  ios_base local_190 [8];
  ios_base local_188 [264];
  ResultCollector local_80;
  
  local_398 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  pRVar22 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar8 = (*pRVar22->_vptr_RenderContext[4])(pRVar22);
  dVar9 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_3b0,(RenderTarget *)CONCAT44(extraout_var,iVar8),0x100,0x100,dVar9);
  iVar8 = (*pRVar22->_vptr_RenderContext[3])(pRVar22);
  lVar24 = CONCAT44(extraout_var_00,iVar8);
  local_3dc = (((this->m_program).m_ptr)->m_program).m_program;
  primitiveType = this->m_primitiveType;
  iVar10 = referencePrimitiveCount
                     (primitiveType,SPACINGMODE_EQUAL,false,iterate::attributes,
                      iterate::attributes + 2);
  iVar8 = -1;
  if ((ulong)primitiveType < 3) {
    iVar8 = *(int *)(&DAT_0094ff60 + (ulong)primitiveType * 4);
  }
  local_250 = pRVar22;
  iVar11 = (*pRVar22->_vptr_RenderContext[3])(pRVar22);
  pOVar12 = glu::objectTraits(OBJECTTYPE_TRANSFORM_FEEDBACK);
  glu::ObjectWrapper::ObjectWrapper
            (&local_248,(Functions *)CONCAT44(extraout_var_01,iVar11),pOVar12);
  local_3d8 = pRVar22;
  iVar11 = (*pRVar22->_vptr_RenderContext[3])(pRVar22);
  pOVar12 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&local_230,(Functions *)CONCAT44(extraout_var_02,iVar11),pOVar12);
  iVar11 = (*local_3d8->_vptr_RenderContext[3])();
  pOVar12 = glu::objectTraits(OBJECTTYPE_QUERY);
  glu::ObjectWrapper::ObjectWrapper
            (&local_218,(Functions *)CONCAT44(extraout_var_03,iVar11),pOVar12);
  iVar11 = (*local_250->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_04,iVar11) + 0x40))(0x8c8e,local_230.m_object);
  local_3a0 = (ulong)(uint)(iVar8 * iVar10);
  (**(code **)(CONCAT44(extraout_var_04,iVar11) + 0x150))
            (0x8c8e,(long)(iVar8 * iVar10 * 4 + 0xc),0,0x88e9);
  tcu::ResultCollector::ResultCollector(&local_80);
  dVar9 = local_3dc;
  (**(code **)(lVar24 + 0x1680))(local_3dc);
  (**(code **)(lVar24 + 0x1a00))(local_3b0.x,local_3b0.y,local_3b0.width,local_3b0.height);
  (**(code **)(lVar24 + 0xfd8))(0x8e72,10);
  (**(code **)(lVar24 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar24 + 0x188))(0x4000);
  local_408._0_8_ = &local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"in_v_attr","");
  local_200._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_200._8_8_ = local_1f0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_200 + 8),local_408._0_8_,(pointer)(local_408._8_8_ + local_408._0_8_))
  ;
  local_1d8 = 0;
  local_2a8._0_4_ = local_200._0_4_;
  local_2a0._M_p = (pointer)&local_290;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a0,local_200._8_8_,
             (char *)(local_200._8_8_ + local_1f0._M_allocated_capacity));
  local_280 = local_1d8;
  local_278.componentType = VTX_COMP_FLOAT;
  local_278.convert = VTX_COMP_CONVERT_NONE;
  local_278.numComponents = 1;
  local_278.numElements = 10;
  local_278.stride = 0;
  local_278.data = iterate::attributes;
  if ((char *)local_200._8_8_ != local_1f0._M_local_buf + 8) {
    operator_delete((void *)local_200._8_8_,local_1f0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._0_8_ != &local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._M_allocated_capacity + 1);
  }
  uVar26 = 0xffffffff;
  if ((ulong)this->m_primitiveType < 3) {
    uVar26 = *(uint *)(&DAT_0094ff6c + (ulong)this->m_primitiveType * 4);
  }
  iVar8 = (*local_250->_vptr_RenderContext[3])();
  lVar24 = CONCAT44(extraout_var_05,iVar8);
  (**(code **)(lVar24 + 0xd0))(0x8e22,local_248.m_object);
  (**(code **)(lVar24 + 0x40))(0x8c8e,local_230.m_object);
  (**(code **)(lVar24 + 0x48))(0x8c8e,0,local_230.m_object);
  (**(code **)(lVar24 + 0x20))(0x8c88,local_218.m_object);
  (**(code **)(lVar24 + 0x30))(uVar26);
  local_200._0_4_ = RGB;
  local_200._4_4_ = UNORM_SHORT_4444;
  local_200._8_4_ = INDEXTYPE_LAST;
  local_1f0._M_allocated_capacity = 0;
  glu::draw(local_250,dVar9,1,(VertexArrayBinding *)local_2a8,(PrimitiveList *)local_200,
            (DrawUtilCallback *)0x0);
  dVar9 = (**(code **)(lVar24 + 0x800))();
  glu::checkError(dVar9,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0x15e);
  (**(code **)(lVar24 + 0x638))();
  (**(code **)(lVar24 + 0x628))(0x8c88);
  local_200._0_4_ = ~R;
  (**(code **)(lVar24 + 0xa20))(local_218.m_object);
  if (local_200._0_4_ == ~PRIMITIVETYPE_TRIANGLES) {
    pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar17,(char *)0x0,"result != (deUint32)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
               ,0x104);
    __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar8 = -1;
  if (uVar26 < 5) {
    iVar8 = *(int *)(&DAT_0094ff78 + (ulong)uVar26 * 4);
  }
  local_38c = local_200._0_4_;
  uVar26 = iVar8 * local_200._0_4_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_340,(long)(int)uVar26,(allocator_type *)local_200);
  puVar6 = local_340.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = (**(code **)(lVar24 + 0xd00))(0x8c8e,0,(long)(int)(uVar26 * 4),1);
  local_3dc = (**(code **)(lVar24 + 0x800))();
  local_2c8 = &local_2b8;
  local_2c0 = 0;
  local_2b8 = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_2c8);
  local_308 = &local_2f8;
  plVar18 = plVar14 + 2;
  if ((long *)*plVar14 == plVar18) {
    local_2f8 = *plVar18;
    lStack_2f0 = plVar14[3];
  }
  else {
    local_2f8 = *plVar18;
    local_308 = (long *)*plVar14;
  }
  local_300 = plVar14[1];
  *plVar14 = (long)plVar18;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  glu::getBufferTargetName(0x8c8e);
  pTVar15 = (TextureFormat *)std::__cxx11::string::append((char *)&local_308);
  local_328 = (TextureFormat)&local_318;
  TVar19 = (TextureFormat)(pTVar15 + 2);
  if (*pTVar15 == TVar19) {
    local_318 = *(long *)TVar19;
    TStack_310 = pTVar15[3];
  }
  else {
    local_318 = *(long *)TVar19;
    local_328 = *pTVar15;
  }
  local_320 = pTVar15[1];
  *pTVar15 = TVar19;
  pTVar15[1].order = R;
  pTVar15[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar15[2].order = R;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_328);
  puVar4 = &local_3d0.m_pixels.m_cap;
  puVar20 = (ulong *)(plVar14 + 2);
  if ((ulong *)*plVar14 == puVar20) {
    local_3d0.m_pixels.m_cap = *puVar20;
    lStack_3b8 = plVar14[3];
    local_3d0._0_8_ = puVar4;
  }
  else {
    local_3d0.m_pixels.m_cap = *puVar20;
    local_3d0._0_8_ = (ulong *)*plVar14;
  }
  local_3d0.m_pixels.m_ptr = (void *)plVar14[1];
  *plVar14 = (long)puVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
  std::ostream::operator<<(local_200,uVar26 * 4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
  std::ios_base::~ios_base(local_190);
  pvVar23 = (void *)0xf;
  if ((undefined8 *)local_3d0._0_8_ != puVar4) {
    pvVar23 = (void *)local_3d0.m_pixels.m_cap;
  }
  if (pvVar23 < (void *)(local_2e0 + (long)local_3d0.m_pixels.m_ptr)) {
    pvVar23 = (void *)0xf;
    if (local_2e8 != local_2d8) {
      pvVar23 = local_2d8[0];
    }
    if ((void *)(local_2e0 + (long)local_3d0.m_pixels.m_ptr) <= pvVar23) {
      pTVar15 = (TextureFormat *)
                std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,local_3d0._0_8_);
      goto LAB_003f2a2b;
    }
  }
  pTVar15 = (TextureFormat *)std::__cxx11::string::_M_append((char *)&local_3d0,(ulong)local_2e8);
LAB_003f2a2b:
  local_388._0_8_ = &local_378;
  TVar19 = (TextureFormat)(pTVar15 + 2);
  if (*pTVar15 == TVar19) {
    local_378 = *(long *)TVar19;
    TStack_370 = pTVar15[3];
  }
  else {
    local_378 = *(long *)TVar19;
    local_388._0_8_ = *pTVar15;
  }
  local_388._8_8_ = pTVar15[1];
  *pTVar15 = TVar19;
  pTVar15[1].order = R;
  pTVar15[1].type = SNORM_INT8;
  *(undefined1 *)TVar19 = 0;
  pTVar15 = (TextureFormat *)std::__cxx11::string::append(local_388);
  local_408._0_8_ = &local_3f8;
  TVar19 = (TextureFormat)(pTVar15 + 2);
  if (*pTVar15 == TVar19) {
    local_3f8._M_allocated_capacity = *(undefined8 *)TVar19;
    local_3f8._8_8_ = pTVar15[3];
  }
  else {
    local_3f8._M_allocated_capacity = *(undefined8 *)TVar19;
    local_408._0_8_ = *pTVar15;
  }
  local_408._8_8_ = pTVar15[1];
  *pTVar15 = TVar19;
  pTVar15[1].order = R;
  pTVar15[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar15[2].order = R;
  glu::checkError(local_3dc,(char *)local_408._0_8_,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0x10d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._0_8_ != &local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._M_allocated_capacity + 1);
  }
  if ((long *)local_388._0_8_ != &local_378) {
    operator_delete((void *)local_388._0_8_,local_378 + 1);
  }
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8,(long)local_2d8[0] + 1);
  }
  if ((undefined8 *)local_3d0._0_8_ != puVar4) {
    operator_delete((void *)local_3d0._0_8_,local_3d0.m_pixels.m_cap + 1);
  }
  if (local_328 != (TextureFormat)&local_318) {
    operator_delete((void *)local_328,local_318 + 1);
  }
  if (local_308 != &local_2f8) {
    operator_delete(local_308,local_2f8 + 1);
  }
  TVar19 = local_398;
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,CONCAT71(uStack_2b7,local_2b8) + 1);
  }
  if (lVar13 == 0) {
    pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar17,(char *)0x0,"mappedData != DE_NULL",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
               ,0x10e);
    __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (0 < (int)uVar26) {
    uVar21 = 0;
    do {
      puVar6[uVar21] = *(uint *)(lVar13 + uVar21 * 4);
      uVar21 = uVar21 + 1;
    } while (uVar26 != uVar21);
  }
  (**(code **)(lVar24 + 0x1670))(0x8c8e);
  local_360 = local_38c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_358,&local_340);
  if (local_340.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_340.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_340.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_340.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  getPixels(&local_3d0,local_3d8,local_3b0.x,local_3b0.y,local_3b0.width,local_3b0.height);
  archive = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_curArchive;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_408,(this->m_referenceImagePath)._M_dataplus._M_p,
             (allocator<char> *)local_388);
  getPNG((TextureLevel *)local_200,archive,(string *)local_408);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._0_8_ != &local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8._M_allocated_capacity + 1);
  }
  tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_408,(TextureLevel *)local_200);
  local_328.order = RGBA;
  local_328.type = UNORM_INT8;
  pvVar23 = (void *)local_3d0.m_pixels.m_cap;
  if ((void *)local_3d0.m_pixels.m_cap != (void *)0x0) {
    pvVar23 = local_3d0.m_pixels.m_ptr;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_388,&local_328,local_3d0.m_width,local_3d0.m_height,1,
             pvVar23);
  bVar7 = tcu::fuzzyCompare((TestLog *)TVar19,"ImageComparison","Image Comparison",
                            (ConstPixelBufferAccess *)local_408,(ConstPixelBufferAccess *)local_388,
                            0.02,COMPARE_LOG_RESULT);
  if (!bVar7) {
    local_408._0_8_ = &local_3f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_408,"Image comparison failed","");
    tcu::ResultCollector::fail(&local_80,(string *)local_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._0_8_ != &local_3f8) {
      operator_delete((void *)local_408._0_8_,local_3f8._M_allocated_capacity + 1);
    }
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_200);
  tcu::Surface::~Surface(&local_3d0);
  TVar5 = local_398;
  if ((int)local_3a0 ==
      (int)((ulong)((long)local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 2)) {
    IVar1 = this->m_ioType;
    if ((ulong)IVar1 < 3) {
      uVar26 = *(uint *)(&DAT_0094ff8c + (ulong)IVar1 * 4);
    }
    else {
      uVar26 = (uint)(IVar1 != IO_TYPE_PER_PATCH_BLOCK_ARRAY) * 3 + 2;
    }
    pSVar16 = (this->m_tesInputs).
              super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_tesInputs).
                            super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar16) >> 4) < 1) {
      iVar8 = 0;
    }
    else {
      lVar13 = 0;
      lVar24 = 0;
      iVar8 = 0;
      do {
        iVar10 = (**(code **)(**(long **)((long)&pSVar16->m_ptr + lVar13) + 0x38))();
        iVar8 = iVar8 + iVar10;
        lVar24 = lVar24 + 1;
        pSVar16 = (this->m_tesInputs).
                  super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar13 = lVar13 + 0x10;
      } while (lVar24 < (int)((ulong)((long)(this->m_tesInputs).
                                            super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar16) >> 4));
    }
    if (0 < (int)local_3a0) {
      uVar27 = iVar8 * uVar26;
      local_3d8 = (RenderContext *)(local_3a0 & 0xffffffff);
      pRVar22 = (RenderContext *)0x0;
      do {
        poVar25 = (ostringstream *)(local_200 + 8);
        if (uVar27 < local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[(long)pRVar22]) {
          local_200._0_4_ = local_398.order;
          local_200._4_4_ = local_398.type;
          std::__cxx11::ostringstream::ostringstream(poVar25);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar25,"Failure: out_te_firstFailedInputIndex has value ",0x30);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar25,", should be in range [0, ",0x19);
          std::ostream::operator<<(poVar25,uVar27);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"]",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar25);
          std::ios_base::~ios_base(local_188);
          local_200._0_8_ = &local_1f0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_200,"Invalid transform feedback output","");
          tcu::ResultCollector::fail(&local_80,(string *)local_200);
LAB_003f31f3:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._0_8_ != &local_1f0) {
            operator_delete((void *)local_200._0_8_,local_1f0._M_allocated_capacity + 1);
          }
        }
        else if (local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)pRVar22] != uVar27) {
          local_200._0_4_ = local_398.order;
          local_200._4_4_ = local_398.type;
          std::__cxx11::ostringstream::ostringstream(poVar25);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar25,
                     "Failure: in tessellation evaluation shader, check for input ",0x3c);
          uVar2 = local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)pRVar22];
          if ((int)uVar2 < 1) {
            iVar8 = 0;
            iVar10 = 0;
          }
          else {
            iVar10 = 0;
            iVar8 = 0;
            do {
              iVar11 = (*((this->m_tesInputs).
                          super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar10].m_ptr)->
                         _vptr_TopLevelObject[7])();
              iVar8 = iVar8 + iVar11 * uVar26;
              iVar10 = iVar10 + 1;
            } while (iVar8 < (int)uVar2);
          }
          if ((int)uVar2 < iVar8) {
            lVar24 = (long)(iVar10 + -1);
            iVar10 = (*((this->m_tesInputs).
                        super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar24].m_ptr)->
                       _vptr_TopLevelObject[7])();
            iVar8 = iVar8 - iVar10 * uVar26;
          }
          else {
            lVar24 = (long)iVar10;
          }
          pTVar3 = (this->m_tesInputs).
                   super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar24].m_ptr;
          (*pTVar3->_vptr_TopLevelObject[8])(local_408,pTVar3,(ulong)(uVar2 - iVar8),(ulong)uVar26);
          this_00 = (ostream *)(local_200 + 8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (this_00,(char *)local_408._0_8_,local_408._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(this_00," failed",7);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._0_8_ != &local_3f8) {
            operator_delete((void *)local_408._0_8_,local_3f8._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
          std::ios_base::~ios_base(local_188);
          local_200._0_8_ = &local_1f0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_200,"Invalid input value in tessellation evaluation shader","")
          ;
          tcu::ResultCollector::fail(&local_80,(string *)local_200);
          goto LAB_003f31f3;
        }
        pRVar22 = (RenderContext *)((long)&pRVar22->_vptr_RenderContext + 1);
      } while (pRVar22 != local_3d8);
    }
  }
  else {
    poVar25 = (ostringstream *)(local_200 + 8);
    local_398.order = TVar19.order;
    local_398.type = TVar19.type;
    local_200._0_4_ = local_398.order;
    local_200._4_4_ = local_398.type;
    local_398 = TVar5;
    std::__cxx11::ostringstream::ostringstream(poVar25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar25,"Failure: transform feedback returned ",0x25);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar25," vertices; expected ",0x14);
    std::ostream::operator<<(poVar25,(int)local_3a0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar25);
    std::ios_base::~ios_base(local_188);
    local_200._0_8_ = &local_1f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200,"Wrong number of vertices","");
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != &local_1f0) {
      operator_delete((void *)local_200._0_8_,local_1f0._M_allocated_capacity + 1);
    }
  }
  if (local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_p != &local_290) {
    operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
  }
  tcu::ResultCollector::setTestContextResult
            (&local_80,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::ObjectWrapper::~ObjectWrapper(&local_218);
  glu::ObjectWrapper::~ObjectWrapper(&local_230);
  glu::ObjectWrapper::~ObjectWrapper(&local_248);
  return STOP;
}

Assistant:

UserDefinedIOCase::IterateResult UserDefinedIOCase::iterate (void)
{
	typedef TransformFeedbackHandler<deUint32> TFHandler;

	TestLog&				log						= m_testCtx.getLog();
	const RenderContext&	renderCtx				= m_context.getRenderContext();
	const RandomViewport	viewport				(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&	gl						= renderCtx.getFunctions();
	static const float		attributes[6+2+2]		= { /* inner */ 3.0f, 4.0f, /* outer */ 5.0f, 6.0f, 7.0f, 8.0f, /* pos. scale */ 1.2f, 1.3f, /* pos. offset */ -0.3f, -0.4f };
	const deUint32			programGL				= m_program->getProgram();
	const int				numVertices				= referenceVertexCount(m_primitiveType, SPACINGMODE_EQUAL, false, &attributes[0], &attributes[2]);
	const TFHandler			tfHandler				(renderCtx, numVertices);
	tcu::ResultCollector	result;

	gl.useProgram(programGL);
	setViewport(gl, viewport);
	gl.patchParameteri(GL_PATCH_VERTICES, DE_LENGTH_OF_ARRAY(attributes));

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	{
		const glu::VertexArrayBinding	bindings[]	= { glu::va::Float("in_v_attr", 1, DE_LENGTH_OF_ARRAY(attributes), 0, &attributes[0]) };
		const TFHandler::Result			tfResult	= tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, false),
																					   DE_LENGTH_OF_ARRAY(bindings), &bindings[0], DE_LENGTH_OF_ARRAY(attributes));

		{
			const tcu::Surface			pixels		= getPixels(renderCtx, viewport);
			const tcu::TextureLevel		reference	= getPNG(m_testCtx.getArchive(), m_referenceImagePath.c_str());
			const bool					success		= tcu::fuzzyCompare(log, "ImageComparison", "Image Comparison", reference.getAccess(), pixels.getAccess(), 0.02f, tcu::COMPARE_LOG_RESULT);

			if (!success)
				result.fail("Image comparison failed");
		}

		if ((int)tfResult.varying.size() != numVertices)
		{
			log << TestLog::Message << "Failure: transform feedback returned " << tfResult.varying.size() << " vertices; expected " << numVertices << TestLog::EndMessage;
			result.fail("Wrong number of vertices");
		}
		else
		{
			const int topLevelArraySize		= (m_ioType == IO_TYPE_PER_PATCH				? 1
											 : m_ioType == IO_TYPE_PER_PATCH_ARRAY			? NUM_PER_PATCH_ARRAY_ELEMS
											 : m_ioType == IO_TYPE_PER_PATCH_BLOCK			? 1
											 : m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
											 : (int)NUM_OUTPUT_VERTICES);
			const int numTEInputs			= numBasicSubobjectsInElementType(m_tesInputs) * topLevelArraySize;

			for (int vertexNdx = 0; vertexNdx < (int)numVertices; vertexNdx++)
			{
				if (tfResult.varying[vertexNdx] > (deUint32)numTEInputs)
				{
					log << TestLog::Message << "Failure: out_te_firstFailedInputIndex has value " << tfResult.varying[vertexNdx]
											<< ", should be in range [0, " << numTEInputs << "]" << TestLog::EndMessage;
					result.fail("Invalid transform feedback output");
				}
				else if (tfResult.varying[vertexNdx] != (deUint32)numTEInputs)
				{
					log << TestLog::Message << "Failure: in tessellation evaluation shader, check for input "
											<< basicSubobjectAtIndex(tfResult.varying[vertexNdx], m_tesInputs, topLevelArraySize) << " failed" << TestLog::EndMessage;
					result.fail("Invalid input value in tessellation evaluation shader");
				}
			}
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}